

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O2

CURLcode Curl_rand_hex(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  ulong num_00;
  uchar buffer [128];
  
  if ((num & 0xffffffffffffff01) == 1) {
    num_00 = num - 1 >> 1;
    CVar1 = Curl_rand_bytes(data,buffer,num_00);
    if (CVar1 == CURLE_OK) {
      Curl_hexencode(buffer,num_00,rnd,num);
      CVar1 = CURLE_OK;
    }
    return CVar1;
  }
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode Curl_rand_hex(struct Curl_easy *data, unsigned char *rnd,
                       size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  unsigned char buffer[128];
  DEBUGASSERT(num > 1);

#ifdef __clang_analyzer__
  /* This silences a scan-build warning about accessing this buffer with
     uninitialized memory. */
  memset(buffer, 0, sizeof(buffer));
#endif

  if((num/2 >= sizeof(buffer)) || !(num&1)) {
    /* make sure it fits in the local buffer and that it is an odd number! */
    DEBUGF(infof(data, "invalid buffer size with Curl_rand_hex"));
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  num--; /* save one for null-termination */

  result = Curl_rand(data, buffer, num/2);
  if(result)
    return result;

  Curl_hexencode(buffer, num/2, rnd, num + 1);
  return result;
}